

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O1

bool __thiscall MockNamedValue::equals(MockNamedValue *this,MockNamedValue *p)

{
  SimpleString *left;
  uint uVar1;
  MockNamedValueComparator *pMVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  SimpleString SStack_228;
  SimpleString local_218;
  SimpleString local_208;
  SimpleString local_1f8;
  SimpleString local_1e8;
  SimpleString local_1d8;
  SimpleString local_1c8;
  SimpleString local_1b8;
  SimpleString local_1a8;
  SimpleString local_198;
  SimpleString local_188;
  SimpleString local_178;
  SimpleString local_168;
  SimpleString local_158;
  SimpleString local_148;
  SimpleString local_138;
  SimpleString local_128;
  SimpleString local_118;
  SimpleString local_108;
  SimpleString local_f8;
  SimpleString local_e8;
  SimpleString local_d8;
  SimpleString local_c8;
  SimpleString local_b8;
  SimpleString local_a8;
  SimpleString local_98;
  SimpleString local_88;
  SimpleString local_78;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48;
  SimpleString local_38;
  
  left = &this->type_;
  SimpleString::SimpleString(&SStack_228,"long int");
  bVar3 = operator==(left,&SStack_228);
  if (bVar3) {
    SimpleString::SimpleString(&local_38,"int");
    bVar3 = operator==(&p->type_,&local_38);
    SimpleString::~SimpleString(&local_38);
  }
  else {
    bVar3 = false;
  }
  SimpleString::~SimpleString(&SStack_228);
  if (bVar3 != false) {
LAB_0022d1ce:
    uVar5 = (ulong)(p->value_).intValue_;
LAB_0022d1d2:
    return (this->value_).longIntValue_ == uVar5;
  }
  SimpleString::SimpleString(&SStack_228,"int");
  bVar3 = operator==(left,&SStack_228);
  if (bVar3) {
    SimpleString::SimpleString(&local_48,"long int");
    bVar3 = operator==(&p->type_,&local_48);
    SimpleString::~SimpleString(&local_48);
  }
  else {
    bVar3 = false;
  }
  SimpleString::~SimpleString(&SStack_228);
  if (bVar3 != false) {
LAB_0022d247:
    uVar5 = (ulong)(this->value_).intValue_;
LAB_0022d24b:
    return (p->value_).longIntValue_ == uVar5;
  }
  SimpleString::SimpleString(&SStack_228,"unsigned int");
  bVar3 = operator==(left,&SStack_228);
  if (bVar3) {
    SimpleString::SimpleString(&local_58,"int");
    bVar3 = operator==(&p->type_,&local_58);
    SimpleString::~SimpleString(&local_58);
  }
  else {
    bVar3 = false;
  }
  SimpleString::~SimpleString(&SStack_228);
  if (bVar3 != false) {
    bVar3 = -1 < (p->value_).intValue_;
    bVar6 = (this->value_).intValue_ == (p->value_).intValue_;
    goto LAB_0022d55a;
  }
  SimpleString::SimpleString(&SStack_228,"int");
  bVar3 = operator==(left,&SStack_228);
  if (bVar3) {
    SimpleString::SimpleString(&local_68,"unsigned int");
    bVar3 = operator==(&p->type_,&local_68);
    SimpleString::~SimpleString(&local_68);
  }
  else {
    bVar3 = false;
  }
  SimpleString::~SimpleString(&SStack_228);
  if (bVar3 != false) {
    bVar3 = -1 < (this->value_).intValue_;
    bVar6 = (this->value_).intValue_ == (p->value_).intValue_;
    goto LAB_0022d55a;
  }
  SimpleString::SimpleString(&SStack_228,"unsigned long int");
  bVar3 = operator==(left,&SStack_228);
  if (bVar3) {
    SimpleString::SimpleString(&local_78,"int");
    bVar3 = operator==(&p->type_,&local_78);
    SimpleString::~SimpleString(&local_78);
  }
  else {
    bVar3 = false;
  }
  SimpleString::~SimpleString(&SStack_228);
  if (bVar3 == false) {
    SimpleString::SimpleString(&SStack_228,"int");
    bVar3 = operator==(left,&SStack_228);
    if (bVar3) {
      SimpleString::SimpleString(&local_88,"unsigned long int");
      bVar3 = operator==(&p->type_,&local_88);
      SimpleString::~SimpleString(&local_88);
    }
    else {
      bVar3 = false;
    }
    SimpleString::~SimpleString(&SStack_228);
    if (bVar3 != false) {
LAB_0022d448:
      bVar3 = -1 < (this->value_).intValue_;
      bVar6 = (p->value_).longIntValue_ == (ulong)(uint)(this->value_).intValue_;
      goto LAB_0022d55a;
    }
    SimpleString::SimpleString(&SStack_228,"unsigned int");
    bVar3 = operator==(left,&SStack_228);
    if (bVar3) {
      SimpleString::SimpleString(&local_98,"long int");
      bVar3 = operator==(&p->type_,&local_98);
      SimpleString::~SimpleString(&local_98);
    }
    else {
      bVar3 = false;
    }
    SimpleString::~SimpleString(&SStack_228);
    if (bVar3 == false) {
      SimpleString::SimpleString(&SStack_228,"long int");
      bVar3 = operator==(left,&SStack_228);
      if (bVar3) {
        SimpleString::SimpleString(&local_a8,"unsigned int");
        bVar3 = operator==(&p->type_,&local_a8);
        SimpleString::~SimpleString(&local_a8);
      }
      else {
        bVar3 = false;
      }
      SimpleString::~SimpleString(&SStack_228);
      if (bVar3 == false) {
        SimpleString::SimpleString(&SStack_228,"unsigned int");
        bVar3 = operator==(left,&SStack_228);
        if (bVar3) {
          SimpleString::SimpleString(&local_b8,"unsigned long int");
          bVar3 = operator==(&p->type_,&local_b8);
          SimpleString::~SimpleString(&local_b8);
        }
        else {
          bVar3 = false;
        }
        SimpleString::~SimpleString(&SStack_228);
        if (bVar3 != false) {
LAB_0022d5e0:
          uVar5 = (ulong)(this->value_).unsignedIntValue_;
          goto LAB_0022d24b;
        }
        SimpleString::SimpleString(&SStack_228,"unsigned long int");
        bVar3 = operator==(left,&SStack_228);
        if (bVar3) {
          SimpleString::SimpleString(&local_c8,"unsigned int");
          bVar3 = operator==(&p->type_,&local_c8);
          SimpleString::~SimpleString(&local_c8);
        }
        else {
          bVar3 = false;
        }
        SimpleString::~SimpleString(&SStack_228);
        if (bVar3 != false) {
LAB_0022d658:
          uVar5 = (ulong)(p->value_).unsignedIntValue_;
          goto LAB_0022d1d2;
        }
        SimpleString::SimpleString(&SStack_228,"long int");
        bVar3 = operator==(left,&SStack_228);
        if (bVar3) {
          SimpleString::SimpleString(&local_d8,"unsigned long int");
          bVar3 = operator==(&p->type_,&local_d8);
          SimpleString::~SimpleString(&local_d8);
        }
        else {
          bVar3 = false;
        }
        SimpleString::~SimpleString(&SStack_228);
        if (bVar3 != false) goto LAB_0022d6cf;
        SimpleString::SimpleString(&SStack_228,"unsigned long int");
        bVar3 = operator==(left,&SStack_228);
        if (bVar3) {
          SimpleString::SimpleString(&local_e8,"long int");
          bVar3 = operator==(&p->type_,&local_e8);
          SimpleString::~SimpleString(&local_e8);
        }
        else {
          bVar3 = false;
        }
        SimpleString::~SimpleString(&SStack_228);
        if (bVar3 != false) goto LAB_0022d751;
        SimpleString::SimpleString(&SStack_228,"long long int");
        bVar3 = operator==(left,&SStack_228);
        if (bVar3) {
          SimpleString::SimpleString(&local_f8,"int");
          bVar3 = operator==(&p->type_,&local_f8);
          SimpleString::~SimpleString(&local_f8);
        }
        else {
          bVar3 = false;
        }
        SimpleString::~SimpleString(&SStack_228);
        if (bVar3 != false) goto LAB_0022d1ce;
        SimpleString::SimpleString(&SStack_228,"int");
        bVar3 = operator==(left,&SStack_228);
        if (bVar3) {
          SimpleString::SimpleString(&local_108,"long long int");
          bVar3 = operator==(&p->type_,&local_108);
          SimpleString::~SimpleString(&local_108);
        }
        else {
          bVar3 = false;
        }
        SimpleString::~SimpleString(&SStack_228);
        if (bVar3 != false) goto LAB_0022d247;
        SimpleString::SimpleString(&SStack_228,"long long int");
        bVar3 = operator==(left,&SStack_228);
        if (bVar3) {
          SimpleString::SimpleString(&local_118,"long int");
          bVar3 = operator==(&p->type_,&local_118);
          SimpleString::~SimpleString(&local_118);
        }
        else {
          bVar3 = false;
        }
        SimpleString::~SimpleString(&SStack_228);
        if (bVar3 != false) {
LAB_0022d924:
          return (this->value_).longIntValue_ == (p->value_).longIntValue_;
        }
        SimpleString::SimpleString(&SStack_228,"long int");
        bVar3 = operator==(left,&SStack_228);
        if (bVar3) {
          SimpleString::SimpleString(&local_128,"long long int");
          bVar3 = operator==(&p->type_,&local_128);
          SimpleString::~SimpleString(&local_128);
        }
        else {
          bVar3 = false;
        }
        SimpleString::~SimpleString(&SStack_228);
        if (bVar3 != false) goto LAB_0022d924;
        SimpleString::SimpleString(&SStack_228,"long long int");
        bVar3 = operator==(left,&SStack_228);
        if (bVar3) {
          SimpleString::SimpleString(&local_138,"unsigned int");
          bVar3 = operator==(&p->type_,&local_138);
          SimpleString::~SimpleString(&local_138);
        }
        else {
          bVar3 = false;
        }
        SimpleString::~SimpleString(&SStack_228);
        if (bVar3 != false) goto LAB_0022d54a;
        SimpleString::SimpleString(&SStack_228,"unsigned int");
        bVar3 = operator==(left,&SStack_228);
        if (bVar3) {
          SimpleString::SimpleString(&local_148,"long long int");
          bVar3 = operator==(&p->type_,&local_148);
          SimpleString::~SimpleString(&local_148);
        }
        else {
          bVar3 = false;
        }
        SimpleString::~SimpleString(&SStack_228);
        if (bVar3 != false) goto LAB_0022d4cb;
        SimpleString::SimpleString(&SStack_228,"long long int");
        bVar3 = operator==(left,&SStack_228);
        if (bVar3) {
          SimpleString::SimpleString(&local_158,"unsigned long int");
          bVar3 = operator==(&p->type_,&local_158);
          SimpleString::~SimpleString(&local_158);
        }
        else {
          bVar3 = false;
        }
        SimpleString::~SimpleString(&SStack_228);
        if (bVar3 != false) {
LAB_0022d6cf:
          bVar3 = -1 < (this->value_).longIntValue_;
          bVar6 = (this->value_).longIntValue_ == (p->value_).longIntValue_;
          goto LAB_0022d55a;
        }
        SimpleString::SimpleString(&SStack_228,"unsigned long int");
        bVar3 = operator==(left,&SStack_228);
        if (bVar3) {
          SimpleString::SimpleString(&local_168,"long long int");
          bVar3 = operator==(&p->type_,&local_168);
          SimpleString::~SimpleString(&local_168);
        }
        else {
          bVar3 = false;
        }
        SimpleString::~SimpleString(&SStack_228);
        if (bVar3 == false) {
          SimpleString::SimpleString(&SStack_228,"long long int");
          bVar3 = operator==(left,&SStack_228);
          if (bVar3) {
            SimpleString::SimpleString(&local_178,"unsigned long long int");
            bVar3 = operator==(&p->type_,&local_178);
            SimpleString::~SimpleString(&local_178);
          }
          else {
            bVar3 = false;
          }
          SimpleString::~SimpleString(&SStack_228);
          if (bVar3 != false) goto LAB_0022d6cf;
          SimpleString::SimpleString(&SStack_228,"unsigned long long int");
          bVar3 = operator==(left,&SStack_228);
          if (bVar3) {
            SimpleString::SimpleString(&local_188,"long long int");
            bVar3 = operator==(&p->type_,&local_188);
            SimpleString::~SimpleString(&local_188);
          }
          else {
            bVar3 = false;
          }
          SimpleString::~SimpleString(&SStack_228);
          if (bVar3 == false) {
            SimpleString::SimpleString(&SStack_228,"unsigned long long int");
            bVar3 = operator==(left,&SStack_228);
            if (bVar3) {
              SimpleString::SimpleString(&local_198,"int");
              bVar3 = operator==(&p->type_,&local_198);
              SimpleString::~SimpleString(&local_198);
            }
            else {
              bVar3 = false;
            }
            SimpleString::~SimpleString(&SStack_228);
            if (bVar3 != false) goto LAB_0022d3c6;
            SimpleString::SimpleString(&SStack_228,"int");
            bVar3 = operator==(left,&SStack_228);
            if (bVar3) {
              SimpleString::SimpleString(&local_1a8,"unsigned long long int");
              bVar3 = operator==(&p->type_,&local_1a8);
              SimpleString::~SimpleString(&local_1a8);
            }
            else {
              bVar3 = false;
            }
            SimpleString::~SimpleString(&SStack_228);
            if (bVar3 != false) goto LAB_0022d448;
            SimpleString::SimpleString(&SStack_228,"unsigned long long int");
            bVar3 = operator==(left,&SStack_228);
            if (bVar3) {
              SimpleString::SimpleString(&local_1b8,"unsigned int");
              bVar3 = operator==(&p->type_,&local_1b8);
              SimpleString::~SimpleString(&local_1b8);
            }
            else {
              bVar3 = false;
            }
            SimpleString::~SimpleString(&SStack_228);
            if (bVar3 != false) goto LAB_0022d658;
            SimpleString::SimpleString(&SStack_228,"unsigned int");
            bVar3 = operator==(left,&SStack_228);
            if (bVar3) {
              SimpleString::SimpleString(&local_1c8,"unsigned long long int");
              bVar3 = operator==(&p->type_,&local_1c8);
              SimpleString::~SimpleString(&local_1c8);
            }
            else {
              bVar3 = false;
            }
            SimpleString::~SimpleString(&SStack_228);
            if (bVar3 != false) goto LAB_0022d5e0;
            SimpleString::SimpleString(&SStack_228,"unsigned long long int");
            bVar3 = operator==(left,&SStack_228);
            if (bVar3) {
              SimpleString::SimpleString(&local_1d8,"long int");
              bVar3 = operator==(&p->type_,&local_1d8);
              SimpleString::~SimpleString(&local_1d8);
            }
            else {
              bVar3 = false;
            }
            SimpleString::~SimpleString(&SStack_228);
            if (bVar3 == false) {
              SimpleString::SimpleString(&SStack_228,"long int");
              bVar3 = operator==(left,&SStack_228);
              if (bVar3) {
                SimpleString::SimpleString(&local_1e8,"unsigned long long int");
                bVar3 = operator==(&p->type_,&local_1e8);
                SimpleString::~SimpleString(&local_1e8);
              }
              else {
                bVar3 = false;
              }
              SimpleString::~SimpleString(&SStack_228);
              if (bVar3 == false) {
                SimpleString::SimpleString(&SStack_228,"unsigned long long int");
                bVar3 = operator==(left,&SStack_228);
                if (bVar3) {
                  SimpleString::SimpleString(&local_1f8,"unsigned long int");
                  bVar3 = operator==(&p->type_,&local_1f8);
                  SimpleString::~SimpleString(&local_1f8);
                }
                else {
                  bVar3 = false;
                }
                SimpleString::~SimpleString(&SStack_228);
                if (bVar3 == false) {
                  SimpleString::SimpleString(&SStack_228,"unsigned long int");
                  bVar3 = operator==(left,&SStack_228);
                  if (bVar3) {
                    SimpleString::SimpleString(&local_208,"unsigned long long int");
                    bVar3 = operator==(&p->type_,&local_208);
                    SimpleString::~SimpleString(&local_208);
                  }
                  else {
                    bVar3 = false;
                  }
                  SimpleString::~SimpleString(&SStack_228);
                  if (bVar3 == false) {
                    bVar3 = operator!=(left,&p->type_);
                    if (bVar3) {
                      return false;
                    }
                    SimpleString::SimpleString(&SStack_228,"bool");
                    bVar3 = operator==(left,&SStack_228);
                    SimpleString::~SimpleString(&SStack_228);
                    if (bVar3) {
                      return (this->value_).boolValue_ == (p->value_).boolValue_;
                    }
                    SimpleString::SimpleString(&SStack_228,"int");
                    bVar3 = operator==(left,&SStack_228);
                    SimpleString::~SimpleString(&SStack_228);
                    if (!bVar3) {
                      SimpleString::SimpleString(&SStack_228,"unsigned int");
                      bVar3 = operator==(left,&SStack_228);
                      SimpleString::~SimpleString(&SStack_228);
                      if (!bVar3) {
                        SimpleString::SimpleString(&SStack_228,"long int");
                        bVar3 = operator==(left,&SStack_228);
                        SimpleString::~SimpleString(&SStack_228);
                        if (!bVar3) {
                          SimpleString::SimpleString(&SStack_228,"unsigned long int");
                          bVar3 = operator==(left,&SStack_228);
                          SimpleString::~SimpleString(&SStack_228);
                          if (!bVar3) {
                            SimpleString::SimpleString(&SStack_228,"long long int");
                            bVar3 = operator==(left,&SStack_228);
                            SimpleString::~SimpleString(&SStack_228);
                            if (!bVar3) {
                              SimpleString::SimpleString(&SStack_228,"unsigned long long int");
                              bVar3 = operator==(left,&SStack_228);
                              SimpleString::~SimpleString(&SStack_228);
                              if (!bVar3) {
                                SimpleString::SimpleString(&SStack_228,"const char*");
                                bVar3 = operator==(left,&SStack_228);
                                SimpleString::~SimpleString(&SStack_228);
                                if (bVar3) {
                                  SimpleString::SimpleString
                                            (&SStack_228,(this->value_).stringValue_);
                                  SimpleString::SimpleString(&local_218,(p->value_).stringValue_);
                                  bVar3 = operator==(&SStack_228,&local_218);
                                  SimpleString::~SimpleString(&local_218);
                                  SimpleString::~SimpleString(&SStack_228);
                                  return bVar3;
                                }
                                SimpleString::SimpleString(&SStack_228,"void*");
                                bVar3 = operator==(left,&SStack_228);
                                SimpleString::~SimpleString(&SStack_228);
                                if (!bVar3) {
                                  SimpleString::SimpleString(&SStack_228,"const void*");
                                  bVar3 = operator==(left,&SStack_228);
                                  SimpleString::~SimpleString(&SStack_228);
                                  if (!bVar3) {
                                    SimpleString::SimpleString(&SStack_228,"void (*)()");
                                    bVar3 = operator==(left,&SStack_228);
                                    SimpleString::~SimpleString(&SStack_228);
                                    if (!bVar3) {
                                      SimpleString::SimpleString(&SStack_228,"double");
                                      bVar3 = operator==(left,&SStack_228);
                                      SimpleString::~SimpleString(&SStack_228);
                                      if (bVar3) {
                                        bVar3 = doubles_equal((this->value_).doubleValue_.value,
                                                              (p->value_).doubleValue_.value,
                                                              (this->value_).doubleValue_.tolerance)
                                        ;
                                        return bVar3;
                                      }
                                      SimpleString::SimpleString(&SStack_228,"const unsigned char*")
                                      ;
                                      bVar3 = operator==(left,&SStack_228);
                                      SimpleString::~SimpleString(&SStack_228);
                                      if (bVar3) {
                                        if (this->size_ != p->size_) {
                                          return false;
                                        }
                                        iVar4 = SimpleString::MemCmp
                                                          ((this->value_).pointerValue_,
                                                           (p->value_).pointerValue_,this->size_);
                                        return iVar4 == 0;
                                      }
                                      pMVar2 = this->comparator_;
                                      if (pMVar2 == (MockNamedValueComparator *)0x0) {
                                        return false;
                                      }
                                      iVar4 = (*pMVar2->_vptr_MockNamedValueComparator[2])
                                                        (pMVar2,(this->value_).longIntValue_,
                                                         (p->value_).longIntValue_);
                                      return (bool)(char)iVar4;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                        goto LAB_0022d924;
                      }
                    }
                    return (this->value_).intValue_ == (p->value_).intValue_;
                  }
                }
                goto LAB_0022d924;
              }
              goto LAB_0022d6cf;
            }
          }
        }
LAB_0022d751:
        uVar5 = (p->value_).longIntValue_;
        bVar3 = -1 < (long)uVar5;
        goto LAB_0022d3d0;
      }
LAB_0022d54a:
      uVar5 = (this->value_).longIntValue_;
      uVar1 = (p->value_).unsignedIntValue_;
    }
    else {
LAB_0022d4cb:
      uVar5 = (p->value_).longIntValue_;
      uVar1 = (this->value_).unsignedIntValue_;
    }
    bVar3 = -1 < (long)uVar5;
    bVar6 = uVar5 == uVar1;
  }
  else {
LAB_0022d3c6:
    bVar3 = -1 < (p->value_).intValue_;
    uVar5 = (ulong)(uint)(p->value_).intValue_;
LAB_0022d3d0:
    bVar6 = (this->value_).longIntValue_ == uVar5;
  }
LAB_0022d55a:
  return (bool)(bVar6 & bVar3);
}

Assistant:

bool MockNamedValue::equals(const MockNamedValue& p) const
{
    if((type_ == "long int") && (p.type_ == "int"))
        return value_.longIntValue_ == p.value_.intValue_;
    else if((type_ == "int") && (p.type_ == "long int"))
        return value_.intValue_ == p.value_.longIntValue_;
    else if((type_ == "unsigned int") && (p.type_ == "int"))
        return (p.value_.intValue_ >= 0) && (value_.unsignedIntValue_ == (unsigned int)p.value_.intValue_);
    else if((type_ == "int") && (p.type_ == "unsigned int"))
        return (value_.intValue_ >= 0) && ((unsigned int)value_.intValue_ == p.value_.unsignedIntValue_);
    else if((type_ == "unsigned long int") && (p.type_ == "int"))
        return (p.value_.intValue_ >= 0) && (value_.unsignedLongIntValue_ == (unsigned long)p.value_.intValue_);
    else if((type_ == "int") && (p.type_ == "unsigned long int"))
        return (value_.intValue_ >= 0) && ((unsigned long)value_.intValue_ == p.value_.unsignedLongIntValue_);
    else if((type_ == "unsigned int") && (p.type_ == "long int"))
        return (p.value_.longIntValue_ >= 0) && (value_.unsignedIntValue_ == (unsigned long)p.value_.longIntValue_);
    else if((type_ == "long int") && (p.type_ == "unsigned int"))
        return (value_.longIntValue_ >= 0) && ((unsigned long)value_.longIntValue_ == p.value_.unsignedIntValue_);
    else if((type_ == "unsigned int") && (p.type_ == "unsigned long int"))
        return value_.unsignedIntValue_ == p.value_.unsignedLongIntValue_;
    else if((type_ == "unsigned long int") && (p.type_ == "unsigned int"))
        return value_.unsignedLongIntValue_ == p.value_.unsignedIntValue_;
    else if((type_ == "long int") && (p.type_ == "unsigned long int"))
        return (value_.longIntValue_ >= 0) && ((unsigned long)value_.longIntValue_ == p.value_.unsignedLongIntValue_);
    else if((type_ == "unsigned long int") && (p.type_ == "long int"))
        return (p.value_.longIntValue_ >= 0) && (value_.unsignedLongIntValue_ == (unsigned long) p.value_.longIntValue_);
#if CPPUTEST_USE_LONG_LONG
    else if ((type_ == "long long int") && (p.type_ == "int"))
        return value_.longLongIntValue_ == p.value_.intValue_;
    else if ((type_ == "int") && (p.type_ == "long long int"))
        return value_.intValue_ == p.value_.longLongIntValue_;
    else if ((type_ == "long long int") && (p.type_ == "long int"))
        return value_.longLongIntValue_ == p.value_.longIntValue_;
    else if ((type_ == "long int") && (p.type_ == "long long int"))
        return value_.longIntValue_ == p.value_.longLongIntValue_;
    else if ((type_ == "long long int") && (p.type_ == "unsigned int"))
        return (value_.longLongIntValue_ >= 0) && ((unsigned long long)value_.longLongIntValue_ == p.value_.unsignedIntValue_);
    else if ((type_ == "unsigned int") && (p.type_ == "long long int"))
        return (p.value_.longLongIntValue_ >= 0) && (value_.unsignedIntValue_ == (unsigned long long)p.value_.longLongIntValue_);
    else if ((type_ == "long long int") && (p.type_ == "unsigned long int"))
        return (value_.longLongIntValue_ >= 0) && ((unsigned long long)value_.longLongIntValue_ == p.value_.unsignedLongIntValue_);
    else if ((type_ == "unsigned long int") && (p.type_ == "long long int"))
        return (p.value_.longLongIntValue_ >= 0) && (value_.unsignedLongIntValue_ == (unsigned long long)p.value_.longLongIntValue_);
    else if ((type_ == "long long int") && (p.type_ == "unsigned long long int"))
        return (value_.longLongIntValue_ >= 0) && ((unsigned long long)value_.longLongIntValue_ == p.value_.unsignedLongLongIntValue_);
    else if ((type_ == "unsigned long long int") && (p.type_ == "long long int"))
        return (p.value_.longLongIntValue_ >= 0) && (value_.unsignedLongLongIntValue_ == (unsigned long long)p.value_.longLongIntValue_);
    else if ((type_ == "unsigned long long int") && (p.type_ == "int"))
        return (p.value_.intValue_ >= 0) && (value_.unsignedLongLongIntValue_ == (unsigned long long)p.value_.intValue_);
    else if ((type_ == "int") && (p.type_ == "unsigned long long int"))
        return (value_.intValue_ >= 0) && ((unsigned long long)value_.intValue_ == p.value_.unsignedLongLongIntValue_);
    else if ((type_ == "unsigned long long int") && (p.type_ == "unsigned int"))
        return value_.unsignedLongLongIntValue_ == p.value_.unsignedIntValue_;
    else if ((type_ == "unsigned int") && (p.type_ == "unsigned long long int"))
        return value_.unsignedIntValue_ == p.value_.unsignedLongLongIntValue_;
    else if ((type_ == "unsigned long long int") && (p.type_ == "long int"))
        return (p.value_.longIntValue_ >= 0) && (value_.unsignedLongLongIntValue_ == (unsigned long long)p.value_.longIntValue_);
    else if ((type_ == "long int") && (p.type_ == "unsigned long long int"))
        return (value_.longIntValue_ >= 0) && ((unsigned long long)value_.longIntValue_ == p.value_.unsignedLongLongIntValue_);
    else if ((type_ == "unsigned long long int") && (p.type_ == "unsigned long int"))
        return value_.unsignedLongLongIntValue_ == p.value_.unsignedLongIntValue_;
    else if ((type_ == "unsigned long int") && (p.type_ == "unsigned long long int"))
        return value_.unsignedLongIntValue_ == p.value_.unsignedLongLongIntValue_;
#endif

    if (type_ != p.type_) return false;

    if (type_ == "bool")
        return value_.boolValue_ == p.value_.boolValue_;
    else if (type_ == "int")
        return value_.intValue_ == p.value_.intValue_;
    else if (type_ == "unsigned int")
        return value_.unsignedIntValue_ == p.value_.unsignedIntValue_;
    else if (type_ == "long int")
        return value_.longIntValue_ == p.value_.longIntValue_;
    else if (type_ == "unsigned long int")
        return value_.unsignedLongIntValue_ == p.value_.unsignedLongIntValue_;
#if CPPUTEST_USE_LONG_LONG
    else if (type_ == "long long int")
        return value_.longLongIntValue_ == p.value_.longLongIntValue_;
    else if (type_ == "unsigned long long int")
        return value_.unsignedLongLongIntValue_ == p.value_.unsignedLongLongIntValue_;
#endif
    else if (type_ == "const char*")
        return SimpleString(value_.stringValue_) == SimpleString(p.value_.stringValue_);
    else if (type_ == "void*")
        return value_.pointerValue_ == p.value_.pointerValue_;
    else if (type_ == "const void*")
        return value_.constPointerValue_ == p.value_.constPointerValue_;
    else if (type_ == "void (*)()")
        return value_.functionPointerValue_ == p.value_.functionPointerValue_;
    else if (type_ == "double")
        return (doubles_equal(value_.doubleValue_.value, p.value_.doubleValue_.value, value_.doubleValue_.tolerance));
    else if (type_ == "const unsigned char*")
    {
        if (size_ != p.size_) {
            return false;
        }
        return SimpleString::MemCmp(value_.memoryBufferValue_, p.value_.memoryBufferValue_, size_) == 0;
    }

    if (comparator_)
        return comparator_->isEqual(value_.constObjectPointerValue_, p.value_.constObjectPointerValue_);

    return false;
}